

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall glslang::TIntermediate::inOutLocationCheck(TIntermediate *this,TInfoSink *infoSink)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  TIntermAggregate *pTVar5;
  undefined4 extraout_var;
  TType *pTVar6;
  reference ppTVar7;
  undefined4 extraout_var_00;
  long *plVar8;
  TQualifier *this_00;
  TQualifier *qualifier;
  TType *type;
  size_t i;
  TIntermSequence *linkObjects;
  int numFragOut;
  bool fragOutWithNoLocation;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  
  bVar1 = false;
  linkObjects._0_4_ = 0;
  pTVar5 = findLinkerObjects(this);
  iVar3 = (*(pTVar5->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])();
  for (type = (TType *)0x0;
      pTVar6 = (TType *)std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                                  ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *
                                   )CONCAT44(extraout_var,iVar3)), type < pTVar6;
      type = (TType *)((long)&type->_vptr_TType + 1)) {
    ppTVar7 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         CONCAT44(extraout_var,iVar3),(size_type)type);
    iVar4 = (*(*ppTVar7)->_vptr_TIntermNode[3])();
    plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0xf0))();
    this_00 = (TQualifier *)(**(code **)(*plVar8 + 0x58))();
    if (((this->language == EShLangFragment) &&
        (((uint)*(undefined8 *)&this_00->field_0x8 & 0x7f) == 4)) &&
       ((*(ulong *)&this_00->field_0x8 >> 7 & 0x1ff) == 0)) {
      linkObjects._0_4_ = (int)linkObjects + 1;
      bVar2 = TQualifier::hasAnyLocation(this_00);
      if (!bVar2) {
        bVar1 = true;
      }
    }
  }
  bVar2 = isEsProfile(this);
  if (((bVar2) && (1 < (int)linkObjects)) && (bVar1)) {
    error(this,infoSink,
          "when more than one fragment shader output, all must have location qualifiers",
          EShLangCount);
  }
  return;
}

Assistant:

void TIntermediate::inOutLocationCheck(TInfoSink& infoSink)
{
    // ES 3.0 requires all outputs to have location qualifiers if there is more than one output
    bool fragOutWithNoLocation = false;
    int numFragOut = 0;

    // TODO: linker functionality: location collision checking

    TIntermSequence& linkObjects = findLinkerObjects()->getSequence();
    for (size_t i = 0; i < linkObjects.size(); ++i) {
        const TType& type = linkObjects[i]->getAsTyped()->getType();
        const TQualifier& qualifier = type.getQualifier();
        if (language == EShLangFragment) {
            if (qualifier.storage == EvqVaryingOut && qualifier.builtIn == EbvNone) {
                ++numFragOut;
                if (!qualifier.hasAnyLocation())
                    fragOutWithNoLocation = true;
            }
        }
    }

    if (isEsProfile()) {
        if (numFragOut > 1 && fragOutWithNoLocation)
            error(infoSink, "when more than one fragment shader output, all must have location qualifiers");
    }
}